

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O3

void __thiscall xray_re::se_monster::se_monster(se_monster *this)

{
  cse_alife_monster_base::cse_alife_monster_base(&this->super_cse_alife_monster_base);
  *(undefined ***)
   &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
    super_cse_alife_creature_abstract = &PTR__se_monster_0024d708;
  *(undefined ***)
   &(this->super_cse_alife_monster_base).super_cse_alife_monster_abstract.
    super_cse_alife_creature_abstract.field_0x118 = &PTR__se_monster_0024d770;
  (this->super_cse_alife_monster_base).super_cse_ph_skeleton._vptr_cse_ph_skeleton =
       (_func_int **)&PTR__se_monster_0024d798;
  *(undefined2 *)&(this->super_cse_alife_monster_base).super_cse_ph_skeleton.field_0x2e = 0;
  (this->m_squad_id)._M_dataplus._M_p = (pointer)&(this->m_squad_id).field_2;
  (this->m_squad_id)._M_string_length = 0;
  (this->m_squad_id).field_2._M_local_buf[0] = '\0';
  this->m_sim_forced_online = false;
  (this->m_off_level_vertex_id)._M_dataplus._M_p = (pointer)&(this->m_off_level_vertex_id).field_2;
  (this->m_off_level_vertex_id)._M_string_length = 0;
  (this->m_off_level_vertex_id).field_2._M_local_buf[0] = '\0';
  (this->m_active_section)._M_dataplus._M_p = (pointer)&(this->m_active_section).field_2;
  (this->m_active_section)._M_string_length = 0;
  (this->m_active_section).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

se_monster::se_monster(): m_job_online(0), m_was_in_smart_terrain(false),
	m_sim_forced_online(false) {}